

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

uintmax_t ghc::filesystem::remove_all(path *p,error_code *ec)

{
  error_code *lhs;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  directory_entry *pdVar4;
  path *p_00;
  uintmax_t uVar5;
  filesystem *this;
  error_code eVar6;
  bool local_ba;
  int local_ac;
  undefined1 local_a8 [3];
  bool is_symlink_result;
  undefined1 local_98 [8];
  directory_iterator iter;
  file_status local_80;
  file_status local_78;
  file_status local_70;
  file_status fs;
  error_code tec;
  path local_48;
  _Alloc_hider *local_28;
  uintmax_t count;
  error_code *ec_local;
  path *p_local;
  
  count = (uintmax_t)ec;
  ec_local = (error_code *)p;
  std::error_code::clear(ec);
  lhs = ec_local;
  local_28 = (_Alloc_hider *)0x0;
  path::path<char[2],ghc::filesystem::path>(&local_48,(char (*) [2])0x2cac83,auto_format);
  bVar1 = operator==((path *)lhs,&local_48);
  path::~path(&local_48);
  if (bVar1) {
    eVar6 = detail::make_error_code(not_supported);
    *(ulong *)count = CONCAT44(tec._M_cat._4_4_,eVar6._M_value);
    *(error_category **)(count + 8) = eVar6._M_cat;
    return (uintmax_t)(path *)0xffffffffffffffff;
  }
  std::error_code::error_code((error_code *)&fs);
  status((filesystem *)&local_70,(path *)ec_local,(error_code *)&fs);
  file_status::file_status(&local_78,&local_70);
  bVar1 = exists(&local_78);
  iter._impl.
  super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  local_ba = false;
  if (bVar1) {
    file_status::file_status(&local_80,&local_70);
    iter._impl.
    super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = 1;
    local_ba = is_directory(&local_80);
  }
  if ((iter._impl.
       super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) != 0) {
    file_status::~file_status(&local_80);
  }
  file_status::~file_status(&local_78);
  if (local_ba != false) {
    directory_iterator::directory_iterator
              ((directory_iterator *)local_98,(path *)ec_local,(error_code *)count);
    while( true ) {
      directory_iterator::directory_iterator((directory_iterator *)local_a8);
      bVar1 = directory_iterator::operator!=
                        ((directory_iterator *)local_98,(directory_iterator *)local_a8);
      directory_iterator::~directory_iterator((directory_iterator *)local_a8);
      if (!bVar1) break;
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)count);
      if ((bVar1) && (bVar1 = detail::is_not_found_error((error_code *)count), !bVar1)) {
        local_ac = 2;
        goto LAB_002b1a06;
      }
      pdVar4 = directory_iterator::operator->((directory_iterator *)local_98);
      bVar1 = directory_entry::is_symlink(pdVar4,(error_code *)count);
      bVar2 = std::error_code::operator_cast_to_bool((error_code *)count);
      if (bVar2) {
        p_local = (path *)0xffffffffffffffff;
        local_ac = 1;
        goto LAB_002b1a06;
      }
      if (bVar1) {
LAB_002b1986:
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)count);
        if (!bVar1) {
          pdVar4 = directory_iterator::operator->((directory_iterator *)local_98);
          this = (filesystem *)directory_entry::path(pdVar4);
          remove(this,(char *)count);
        }
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)count);
        if (bVar1) {
          p_local = (path *)0xffffffffffffffff;
          local_ac = 1;
          goto LAB_002b1a06;
        }
        local_28 = local_28 + 1;
      }
      else {
        pdVar4 = directory_iterator::operator->((directory_iterator *)local_98);
        bVar1 = directory_entry::is_directory(pdVar4,(error_code *)count);
        if (!bVar1) goto LAB_002b1986;
        pdVar4 = directory_iterator::operator->((directory_iterator *)local_98);
        p_00 = directory_entry::path(pdVar4);
        uVar5 = remove_all(p_00,(error_code *)count);
        local_28 = local_28 + uVar5;
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)count);
        if (bVar1) {
          p_local = (path *)0xffffffffffffffff;
          local_ac = 1;
          goto LAB_002b1a06;
        }
      }
      directory_iterator::increment((directory_iterator *)local_98,(error_code *)count);
    }
    local_ac = 2;
LAB_002b1a06:
    directory_iterator::~directory_iterator((directory_iterator *)local_98);
    if (local_ac != 2) goto LAB_002b1a84;
  }
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)count);
  if ((!bVar1) && (uVar3 = remove((filesystem *)ec_local,(char *)count), (uVar3 & 1) != 0)) {
    local_28 = (_Alloc_hider *)&((impl_string_type *)&local_28->field_0x0)->field_0x1;
  }
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)count);
  if (bVar1) {
    p_local = (path *)0xffffffffffffffff;
  }
  else {
    p_local = (path *)local_28;
  }
LAB_002b1a84:
  file_status::~file_status(&local_70);
  return (uintmax_t)p_local;
}

Assistant:

GHC_INLINE uintmax_t remove_all(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
    uintmax_t count = 0;
    if (p == "/") {
        ec = detail::make_error_code(detail::portable_error::not_supported);
        return static_cast<uintmax_t>(-1);
    }
    std::error_code tec;
    auto fs = status(p, tec);
    if (exists(fs) && is_directory(fs)) {
        for (auto iter = directory_iterator(p, ec); iter != directory_iterator(); iter.increment(ec)) {
            if (ec && !detail::is_not_found_error(ec)) {
                break;
            }
            bool is_symlink_result = iter->is_symlink(ec);
            if (ec)
                return static_cast<uintmax_t>(-1);
            if (!is_symlink_result && iter->is_directory(ec)) {
                count += remove_all(iter->path(), ec);
                if (ec) {
                    return static_cast<uintmax_t>(-1);
                }
            }
            else {
                if (!ec) {
                    remove(iter->path(), ec);
                }
                if (ec) {
                    return static_cast<uintmax_t>(-1);
                }
                ++count;
            }
        }
    }
    if (!ec) {
        if (remove(p, ec)) {
            ++count;
        }
    }
    if (ec) {
        return static_cast<uintmax_t>(-1);
    }
    return count;
}